

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaDAG.cpp
# Opt level: O1

void __thiscall MatryoshkaDAG::computeTopK(MatryoshkaDAG *this)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  double *pdVar4;
  size_t sVar5;
  undefined8 uVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  value_type nonDomainCandidate;
  heapT heapOPTDomain;
  heapT heapOPTNonDomain;
  value_type domainCandidate;
  value_type local_d8;
  ulong local_c0;
  binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
  local_b8;
  binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
  local_88;
  value_type local_58;
  long local_40;
  long local_38;
  
  if (1 < this->params->n) {
    uVar10 = 2;
    lVar8 = 0;
    do {
      local_88.trees.super_type.data_.root_plus_size_.super_size_traits.size_ = 0;
      local_88.super_type.super_base_type.super_size_holder<true,_unsigned_long>.size_ =
           (base_type)(size_holder<true,_unsigned_long>)0x0;
      local_88.top_element = (node_pointer)0x0;
      local_88.trees.super_type.data_.root_plus_size_.m_header.super_node.next_ =
           &local_88.trees.super_type.data_.root_plus_size_.m_header.super_node;
      local_b8.trees.super_type.data_.root_plus_size_.super_size_traits.size_ = 0;
      local_b8.super_type.super_base_type.super_size_holder<true,_unsigned_long>.size_ =
           (base_type)(size_holder<true,_unsigned_long>)0x0;
      local_b8.top_element = (node_pointer)0x0;
      local_b8.trees.super_type.data_.root_plus_size_.m_header.super_node.next_ =
           &local_b8.trees.super_type.data_.root_plus_size_.m_header.super_node;
      local_b8.trees.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
           local_b8.trees.super_type.data_.root_plus_size_.m_header.super_node.next_;
      local_88.trees.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
           local_88.trees.super_type.data_.root_plus_size_.m_header.super_node.next_;
      if (1 < uVar10) {
        sVar7 = 1;
        lVar9 = 0;
        do {
          pdVar4 = *(double **)
                    ((long)&(((this->OPTD).
                              super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                            )._M_impl.super__Vector_impl_data + lVar9);
          local_d8.score = *pdVar4;
          local_d8.backOptimalIndex = (size_t)pdVar4[2];
          local_d8.backPointer = sVar7;
          boost::heap::
          binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
          ::push(&local_88,&local_d8);
          pdVar4 = *(double **)
                    ((long)&(((this->OPT).
                              super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                            )._M_impl.super__Vector_impl_data + lVar9);
          local_58.backOptimalIndex = (size_t)pdVar4[2];
          local_58.score = *pdVar4;
          local_58.backPointer = (size_t)pdVar4[1];
          dVar11 = q(this,sVar7,uVar10);
          local_58.score = dVar11 + local_58.score;
          local_58.backPointer = sVar7;
          boost::heap::
          binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
          ::push(&local_b8,&local_58);
          lVar1 = lVar8 + sVar7;
          sVar7 = sVar7 + 1;
          lVar9 = lVar9 + 0x18;
        } while (lVar1 != 1);
      }
      local_c0 = uVar10;
      local_40 = lVar8;
      if (this->params->K != 0) {
        local_38 = uVar10 * 0x18;
        lVar8 = 0;
        lVar9 = 0;
        uVar10 = 0;
        do {
          if (local_b8.top_element == (node_pointer)0x0) {
LAB_0013eb15:
            __assert_fail("!empty()","/usr/include/boost/heap/binomial_heap.hpp",0x152,
                          "const_reference boost::heap::binomial_heap<MatryoshkaDAG::SubProblem>::top() const [T = MatryoshkaDAG::SubProblem, A0 = boost::parameter::void_, A1 = boost::parameter::void_, A2 = boost::parameter::void_, A3 = boost::parameter::void_]"
                         );
          }
          lVar1 = *(long *)((long)&(((this->OPTD).
                                     super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                                   )._M_impl.super__Vector_impl_data + local_38);
          *(size_t *)(lVar1 + 0x10 + lVar8) =
               ((local_b8.top_element)->super_heap_node<MatryoshkaDAG::SubProblem,_true>).value.
               backOptimalIndex;
          dVar11 = (double)((local_b8.top_element)->super_heap_node<MatryoshkaDAG::SubProblem,_true>
                           ).value.backPointer;
          pdVar4 = (double *)(lVar1 + lVar8);
          *pdVar4 = ((local_b8.top_element)->super_heap_node<MatryoshkaDAG::SubProblem,_true>).value
                    .score;
          pdVar4[1] = dVar11;
          lVar1 = *(long *)((long)&(((this->OPTD).
                                     super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                                   )._M_impl.super__Vector_impl_data + local_38);
          boost::heap::
          binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
          ::pop(&local_b8);
          dVar11 = (double)(*(long *)(lVar1 + 0x10 + lVar8) + 1);
          if ((ulong)dVar11 < this->params->K) {
            sVar7 = *(size_t *)(lVar1 + 8 + lVar8);
            lVar1 = *(long *)&(this->OPT).
                              super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[sVar7 - 1].
                              super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                              ._M_impl.super__Vector_impl_data;
            local_d8.backOptimalIndex = *(size_t *)(lVar1 + 0x10 + (long)dVar11 * 0x18);
            pdVar4 = (double *)(lVar1 + (long)dVar11 * 0x18);
            local_d8.score = *pdVar4;
            local_d8.backPointer = (size_t)pdVar4[1];
            dVar12 = q(this,sVar7,local_c0);
            local_d8.score = dVar12 + local_d8.score;
            local_d8.backPointer = sVar7;
            local_d8.backOptimalIndex = (size_t)dVar11;
            boost::heap::
            binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
            ::push(&local_b8,&local_d8);
          }
          if (local_88.top_element == (node_pointer)0x0) goto LAB_0013eb15;
          dVar11 = ((local_88.top_element)->super_heap_node<MatryoshkaDAG::SubProblem,_true>).value.
                   score;
          lVar1 = *(long *)&(this->OPTD).
                            super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[local_c0].
                            super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                            ._M_impl.super__Vector_impl_data;
          pdVar4 = (double *)(lVar1 + lVar9 * 0x18);
          if (dVar11 < *pdVar4 || dVar11 == *pdVar4) {
            puVar2 = (undefined8 *)(lVar1 + lVar9 * 0x18);
            lVar1 = *(long *)&(this->OPT).
                              super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_c0].
                              super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                              ._M_impl.super__Vector_impl_data;
            *(undefined8 *)(lVar1 + 0x10 + lVar8) = puVar2[2];
            uVar6 = puVar2[1];
            puVar3 = (undefined8 *)(lVar1 + lVar8);
            *puVar3 = *puVar2;
            puVar3[1] = uVar6;
            lVar9 = lVar9 + 1;
          }
          else {
            sVar7 = ((local_88.top_element)->super_heap_node<MatryoshkaDAG::SubProblem,_true>).value
                    .backPointer;
            sVar5 = ((local_88.top_element)->super_heap_node<MatryoshkaDAG::SubProblem,_true>).value
                    .backOptimalIndex;
            lVar1 = *(long *)&(this->OPT).
                              super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_c0].
                              super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                              ._M_impl.super__Vector_impl_data;
            *(double *)(lVar1 + lVar8) = dVar11;
            *(size_t *)(lVar1 + 8 + lVar8) = sVar7;
            *(size_t *)(lVar1 + 0x10 + lVar8) = sVar5;
            boost::heap::
            binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
            ::pop(&local_88);
            dVar11 = (double)(sVar5 + 1);
            if ((ulong)dVar11 < this->params->K) {
              local_d8.score =
                   *(double *)
                    (*(long *)&(this->OPTD).
                               super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[sVar7 - 1].
                               super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                               ._M_impl.super__Vector_impl_data + (long)dVar11 * 0x18);
              local_d8.backPointer = sVar7;
              local_d8.backOptimalIndex = (size_t)dVar11;
              boost::heap::
              binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
              ::push(&local_88,&local_d8);
            }
          }
          uVar10 = uVar10 + 1;
          lVar8 = lVar8 + 0x18;
        } while (uVar10 < this->params->K);
      }
      boost::heap::
      binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
      ::~binomial_heap(&local_b8);
      boost::heap::
      binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
      ::~binomial_heap(&local_88);
      uVar10 = local_c0 + 1;
      lVar8 = local_40 + -1;
    } while (uVar10 <= this->params->n);
  }
  return;
}

Assistant:

void MatryoshkaDAG::computeTopK() {
    //std::cerr << "begin computeTopK()\n";
    for (size_t l=2; l<=params->n; l++) {
        /*
        
        OPT(l) = max{  max_{ k<l } OPTD(k-1),  // OPT(l) ends in a non-domain
                       OPTD(l) }               // OPT(l) ends in a domain
        
        OPTD(l) = max_{ k<l } OPT(k-1) + q(k,l)
        
        */
        using heapT = boost::heap::binomial_heap<SubProblem>;
        heapT heapOPTNonDomain;
        heapT heapOPTDomain;

        for (size_t k=1; k<l; k++) {
            auto nonDomainCandidate = OPTD[k-1][0];
            nonDomainCandidate.backPointer = k;
            heapOPTNonDomain.push(nonDomainCandidate); 

            auto domainCandidate = OPT[k-1][0];
            domainCandidate.score += q(k,l);
            domainCandidate.backPointer = k;
            heapOPTDomain.push(domainCandidate);
        }

        auto pushSubProblem = [&](heapT & heap, SubProblem & subProb, bool isDomain) {
            heap.pop();
            auto nextOptimalIndex = subProb.backOptimalIndex + 1;
            auto k = subProb.backPointer;

            if (nextOptimalIndex < params->K) {
                SubProblem newCandidate;
                if (isDomain) {
                    newCandidate = OPT[k-1][nextOptimalIndex];
                    newCandidate.score += q(k,l);
                } else {
                    newCandidate = OPTD[k-1][nextOptimalIndex];
                }
                newCandidate.backPointer = k;
                newCandidate.backOptimalIndex = nextOptimalIndex;
                heap.push(newCandidate);
            }
        };

        size_t i = 0;
        size_t j = 0;
        while (i < params->K) {
            OPTD[l][i] = heapOPTDomain.top();
            pushSubProblem(heapOPTDomain, OPTD[l][i], true);
            auto nonDomainCandidate = heapOPTNonDomain.top();
             
            if (nonDomainCandidate.score > OPTD[l][j].score) {
                OPT[l][i] = nonDomainCandidate;
                pushSubProblem(heapOPTNonDomain, nonDomainCandidate, false);
            } else {
                OPT[l][i] = OPTD[l][j];
                j++;
            }

            i++;    
        }
    }

    /*std::cerr << "In topK()\n";
    for (size_t i = 0; i < params->K; ++i) {
        std::cerr << "The " << i << "th-best solution had score " << OPT[params->n][i].score << "\n";
    }*/
}